

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QString * __thiscall QUrl::fileName(QUrl *this,ComponentFormattingOptions options)

{
  long lVar1;
  qsizetype qVar2;
  undefined4 in_EDX;
  QUrl *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype slash;
  QString ourPath;
  undefined4 in_stack_ffffffffffffff88;
  CaseSensitivity in_stack_ffffffffffffff8c;
  QString *pQVar3;
  QString *n;
  undefined4 in_stack_ffffffffffffffd0;
  QString *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = in_RDI;
  n = in_RDI;
  path(in_RSI,(ComponentFormattingOptions)0xaaaaaaaa);
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffd2,L'/');
  qVar2 = QString::lastIndexOf
                    (in_RDI,(QChar)(char16_t)((ulong)pQVar3 >> 0x30),in_stack_ffffffffffffff8c);
  if (qVar2 == -1) {
    QString::QString(in_RDI,(QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                    );
  }
  else {
    QString::mid(this_00,CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(qsizetype)n);
  }
  QString::~QString((QString *)0x2fc5fb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrl::fileName(ComponentFormattingOptions options) const
{
    const QString ourPath = path(options);
    const qsizetype slash = ourPath.lastIndexOf(u'/');
    if (slash == -1)
        return ourPath;
    return ourPath.mid(slash + 1);
}